

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::DelKey
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key)

{
  bool bVar1;
  int iVar2;
  FName local_50;
  FName local_4c;
  Node *local_48;
  Node *n;
  FName local_38;
  THashTraits<FName> local_31;
  Node *pNStack_30;
  THashTraits<FName> Traits;
  Node **mpp;
  Node *local_20;
  Node *mp;
  FName *key_local;
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this_local;
  
  mp = (Node *)key;
  key_local = (FName *)this;
  FName::FName((FName *)((long)&mpp + 4),key);
  local_20 = MainPosition(this,(FName *)((long)&mpp + 4));
  bVar1 = Node::IsNil(local_20);
  if (!bVar1) {
    FName::FName(&local_38,&(local_20->Pair).Key);
    FName::FName((FName *)((long)&n + 4),key);
    iVar2 = THashTraits<FName>::Compare(&local_31,&local_38,(FName *)((long)&n + 4));
    if (iVar2 == 0) {
      if (local_20->Next == (Node *)0x0) {
        Node::SetNil(local_20);
      }
      else {
        local_48 = local_20->Next;
        CopyNode(this,local_20,local_48);
        Node::SetNil(local_48);
      }
      this->NumUsed = this->NumUsed - 1;
    }
    else {
      pNStack_30 = local_20;
      local_20 = local_20->Next;
      while( true ) {
        bVar1 = false;
        if (local_20 != (Node *)0x0) {
          FName::FName(&local_4c,&(local_20->Pair).Key);
          FName::FName(&local_50,key);
          iVar2 = THashTraits<FName>::Compare(&local_31,&local_4c,&local_50);
          bVar1 = iVar2 != 0;
        }
        if (!bVar1) break;
        pNStack_30 = local_20;
        local_20 = local_20->Next;
      }
      if (local_20 != (Node *)0x0) {
        pNStack_30->Next = local_20->Next;
        Node::SetNil(local_20);
        this->NumUsed = this->NumUsed - 1;
      }
    }
  }
  return;
}

Assistant:

void DelKey(const KT key)
	{
		Node *mp = MainPosition(key), **mpp;
		HashTraits Traits;

		if (mp->IsNil())
		{
			/* the key is definitely not present, because there is nothing at its main position */
		}
		else if (!Traits.Compare(mp->Pair.Key, key)) /* the key is in its main position */
		{
			if (mp->Next != NULL)		/* move next node to its main position */
			{
				Node *n = mp->Next;
				mp->~Node();			/* deconstruct old node */
				CopyNode(mp, n);		/* copy next node */
				n->SetNil();			/* next node is now nil */
			}
			else
			{
				mp->~Node();
				mp->SetNil();			/* there is no chain, so main position is nil */
			}
			--NumUsed;
		}
		else	/* the key is either not present or not in its main position */
		{
			for (mpp = &mp->Next, mp = *mpp; mp != NULL && Traits.Compare(mp->Pair.Key, key); mpp = &mp->Next, mp = *mpp)
			{ }							/* look for the key */
			if (mp != NULL)				/* found it */
			{
				*mpp = mp->Next;		/* rechain so this node is skipped */
				mp->~Node();
				mp->SetNil();			/* because this node is now nil */
				--NumUsed;
			}
		}
	}